

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zeEventQueryKernelTimestamp(ze_event_handle_t hEvent,ze_kernel_timestamp_result_t *dstptr)

{
  ze_result_t zVar1;
  
  if (DAT_0010e5a0 != (code *)0x0) {
    zVar1 = (*DAT_0010e5a0)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventQueryKernelTimestamp(
        ze_event_handle_t hEvent,                       ///< [in] handle of the event
        ze_kernel_timestamp_result_t* dstptr            ///< [in,out] pointer to memory for where timestamp result will be written.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnQueryKernelTimestamp = context.zeDdiTable.Event.pfnQueryKernelTimestamp;
        if( nullptr != pfnQueryKernelTimestamp )
        {
            result = pfnQueryKernelTimestamp( hEvent, dstptr );
        }
        else
        {
            // generic implementation
        }

        return result;
    }